

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O1

uint Validator::constraintS2(Solution *solution)

{
  pointer pcVar1;
  pointer ppTVar2;
  Turn *this;
  bool bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar9;
  Scenario *pSVar10;
  Nurse *pNVar11;
  string *psVar12;
  History *pHVar13;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar14;
  ShiftType *pSVar15;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
  *pmVar16;
  mapped_type *pmVar17;
  _Base_ptr p_Var18;
  uint uVar19;
  long lVar20;
  long lVar21;
  string lastShift;
  Contract contract;
  long *local_d0;
  size_t local_c8;
  long local_c0 [2];
  _Base_ptr local_b0;
  _Base_ptr local_a8;
  pointer local_a0;
  pointer local_98;
  Contract local_90;
  string local_50;
  
  pmVar9 = Solution::getNurses_abi_cxx11_(solution);
  p_Var18 = (pmVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8 = &(pmVar9->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var18 == local_a8) {
    uVar19 = 0;
  }
  else {
    uVar19 = 0;
    do {
      pSVar10 = Scenario::getInstance();
      pNVar11 = NurseSolution::getNurse(*(NurseSolution **)(p_Var18 + 2));
      psVar12 = Nurse::getContract_abi_cxx11_(pNVar11);
      pcVar1 = (psVar12->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + psVar12->_M_string_length);
      Scenario::getContract(&local_90,pSVar10,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pNVar11 = NurseSolution::getNurse(*(NurseSolution **)(p_Var18 + 2));
      pHVar13 = Nurse::getHistory(pNVar11);
      iVar5 = History::getNumberOfConsecutiveAssignments(pHVar13);
      pNVar11 = NurseSolution::getNurse(*(NurseSolution **)(p_Var18 + 2));
      pHVar13 = Nurse::getHistory(pNVar11);
      iVar6 = History::getNumberOfConsecutiveWorkingDays(pHVar13);
      pNVar11 = NurseSolution::getNurse(*(NurseSolution **)(p_Var18 + 2));
      pHVar13 = Nurse::getHistory(pNVar11);
      psVar12 = History::getLastAssignedShiftType_abi_cxx11_(pHVar13);
      pcVar1 = (psVar12->_M_dataplus)._M_p;
      local_d0 = local_c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar1,pcVar1 + psVar12->_M_string_length);
      pvVar14 = NurseSolution::getTurns(*(NurseSolution **)(p_Var18 + 2));
      ppTVar2 = (pvVar14->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_98 = (pvVar14->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      local_b0 = p_Var18;
      if (ppTVar2 != local_98) {
        iVar8 = -1;
        lVar21 = 1;
        lVar20 = 0;
        local_a0 = ppTVar2;
        do {
          this = local_a0[lVar21 + -1];
          iVar7 = std::__cxx11::string::compare((char *)&local_d0);
          if (iVar7 == 0) {
            iVar6 = 1;
LAB_00113a61:
            bVar3 = false;
          }
          else {
            iVar7 = Turn::getDay(this);
            if (iVar7 == iVar8 + 1) {
              iVar6 = iVar6 + 1;
              goto LAB_00113a61;
            }
            iVar8 = Contract::getMinimumNumberOfConsecutiveWorkingDays(&local_90);
            if (iVar6 < iVar8) {
              iVar8 = Contract::getMinimumNumberOfConsecutiveWorkingDays(&local_90);
              uVar19 = (iVar8 - iVar6) * 0x1e + uVar19;
            }
            else {
              iVar8 = Contract::getMaximumNumberOfConsecutiveWorkingDays(&local_90);
              if (iVar8 < iVar6) {
                iVar8 = Contract::getMinimumNumberOfConsecutiveWorkingDays(&local_90);
                uVar19 = (iVar6 - iVar8) * 0x1e + uVar19;
              }
            }
            pSVar10 = Scenario::getInstance();
            pmVar16 = Scenario::getShifts_abi_cxx11_(pSVar10);
            pSVar15 = Turn::getShiftType(this);
            psVar12 = ShiftType::getId_abi_cxx11_(pSVar15);
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                      ::at(pmVar16,psVar12);
            iVar8 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar17);
            if (iVar5 < iVar8) {
              pSVar10 = Scenario::getInstance();
              pmVar16 = Scenario::getShifts_abi_cxx11_(pSVar10);
              pSVar15 = Turn::getShiftType(this);
              psVar12 = ShiftType::getId_abi_cxx11_(pSVar15);
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                        ::at(pmVar16,psVar12);
              iVar6 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar17);
              uVar19 = uVar19 + (iVar6 - iVar5) * 0xf;
            }
            else {
              pSVar10 = Scenario::getInstance();
              pmVar16 = Scenario::getShifts_abi_cxx11_(pSVar10);
              pSVar15 = Turn::getShiftType(this);
              psVar12 = ShiftType::getId_abi_cxx11_(pSVar15);
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                        ::at(pmVar16,psVar12);
              iVar8 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar17);
              if (iVar8 < iVar6) {
                pSVar10 = Scenario::getInstance();
                pmVar16 = Scenario::getShifts_abi_cxx11_(pSVar10);
                pSVar15 = Turn::getShiftType(this);
                psVar12 = ShiftType::getId_abi_cxx11_(pSVar15);
                pmVar17 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                          ::at(pmVar16,psVar12);
                iVar6 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar17);
                uVar19 = uVar19 + (iVar5 - iVar6) * 0xf;
              }
            }
            bVar3 = true;
            iVar5 = 1;
            iVar6 = 1;
          }
          if (!bVar3) {
            iVar8 = std::__cxx11::string::compare((char *)&local_d0);
            if (iVar8 != 0) {
              pSVar15 = Turn::getShiftType(this);
              psVar12 = ShiftType::getId_abi_cxx11_(pSVar15);
              if ((local_c8 == psVar12->_M_string_length) &&
                 ((local_c8 == 0 ||
                  (iVar8 = bcmp(local_d0,(psVar12->_M_dataplus)._M_p,local_c8), iVar8 == 0)))) {
                iVar5 = iVar5 + 1;
                goto LAB_00113d45;
              }
              pSVar10 = Scenario::getInstance();
              pmVar16 = Scenario::getShifts_abi_cxx11_(pSVar10);
              pSVar15 = Turn::getShiftType(this);
              psVar12 = ShiftType::getId_abi_cxx11_(pSVar15);
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                        ::at(pmVar16,psVar12);
              iVar8 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar17);
              if (iVar5 < iVar8) {
                pSVar10 = Scenario::getInstance();
                pmVar16 = Scenario::getShifts_abi_cxx11_(pSVar10);
                pSVar15 = Turn::getShiftType(this);
                psVar12 = ShiftType::getId_abi_cxx11_(pSVar15);
                pmVar17 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                          ::at(pmVar16,psVar12);
                iVar8 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar17);
                iVar8 = iVar8 - iVar5;
              }
              else {
                pSVar10 = Scenario::getInstance();
                pmVar16 = Scenario::getShifts_abi_cxx11_(pSVar10);
                pSVar15 = Turn::getShiftType(this);
                psVar12 = ShiftType::getId_abi_cxx11_(pSVar15);
                pmVar17 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                          ::at(pmVar16,psVar12);
                iVar8 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar17);
                if (iVar6 <= iVar8) goto LAB_00113d3b;
                pSVar10 = Scenario::getInstance();
                pmVar16 = Scenario::getShifts_abi_cxx11_(pSVar10);
                pSVar15 = Turn::getShiftType(this);
                psVar12 = ShiftType::getId_abi_cxx11_(pSVar15);
                pmVar17 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                          ::at(pmVar16,psVar12);
                iVar8 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar17);
                iVar8 = iVar5 - iVar8;
              }
              uVar19 = uVar19 + iVar8 * 0xf;
            }
LAB_00113d3b:
            iVar5 = 1;
          }
LAB_00113d45:
          pSVar15 = Turn::getShiftType(this);
          ShiftType::getId_abi_cxx11_(pSVar15);
          std::__cxx11::string::_M_assign((string *)&local_d0);
          iVar8 = Turn::getDay(this);
          pvVar14 = NurseSolution::getTurns(*(NurseSolution **)(local_b0 + 2));
          if ((lVar21 == (long)(pvVar14->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar14->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3) &&
             (iVar7 = Turn::getDay(this), iVar7 != 6)) {
            iVar7 = Contract::getMinimumNumberOfConsecutiveWorkingDays(&local_90);
            if (iVar6 < iVar7) {
              iVar7 = Contract::getMinimumNumberOfConsecutiveWorkingDays(&local_90);
              uVar19 = (iVar7 - iVar6) * 0x1e + uVar19;
            }
            else {
              iVar7 = Contract::getMaximumNumberOfConsecutiveWorkingDays(&local_90);
              if (iVar7 < iVar6) {
                iVar7 = Contract::getMinimumNumberOfConsecutiveWorkingDays(&local_90);
                uVar19 = (iVar6 - iVar7) * 0x1e + uVar19;
              }
            }
            pSVar10 = Scenario::getInstance();
            pmVar16 = Scenario::getShifts_abi_cxx11_(pSVar10);
            pSVar15 = Turn::getShiftType(this);
            psVar12 = ShiftType::getId_abi_cxx11_(pSVar15);
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                      ::at(pmVar16,psVar12);
            iVar7 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar17);
            if (iVar5 < iVar7) {
              pSVar10 = Scenario::getInstance();
              pmVar16 = Scenario::getShifts_abi_cxx11_(pSVar10);
              pSVar15 = Turn::getShiftType(this);
              psVar12 = ShiftType::getId_abi_cxx11_(pSVar15);
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                        ::at(pmVar16,psVar12);
              iVar7 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar17);
              iVar7 = iVar7 - iVar5;
            }
            else {
              pSVar10 = Scenario::getInstance();
              pmVar16 = Scenario::getShifts_abi_cxx11_(pSVar10);
              pSVar15 = Turn::getShiftType(this);
              psVar12 = ShiftType::getId_abi_cxx11_(pSVar15);
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                        ::at(pmVar16,psVar12);
              iVar7 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar17);
              if (iVar6 <= iVar7) goto LAB_00113ef6;
              pSVar10 = Scenario::getInstance();
              pmVar16 = Scenario::getShifts_abi_cxx11_(pSVar10);
              pSVar15 = Turn::getShiftType(this);
              psVar12 = ShiftType::getId_abi_cxx11_(pSVar15);
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                        ::at(pmVar16,psVar12);
              iVar7 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar17);
              iVar7 = iVar5 - iVar7;
            }
            uVar19 = uVar19 + iVar7 * 0xf;
          }
LAB_00113ef6:
          lVar21 = lVar21 + 1;
          lVar4 = lVar20 + 8;
          lVar20 = lVar20 + 8;
        } while ((pointer)((long)local_a0 + lVar4) != local_98);
      }
      p_Var18 = local_b0;
      if (local_d0 != local_c0) {
        operator_delete(local_d0,local_c0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.id._M_dataplus._M_p != &local_90.id.field_2) {
        operator_delete(local_90.id._M_dataplus._M_p,local_90.id.field_2._M_allocated_capacity + 1);
      }
      p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
    } while (p_Var18 != local_a8);
  }
  return uVar19;
}

Assistant:

unsigned int Validator::constraintS2(const Solution &solution){

    unsigned int sum = 0;

    for(auto const &nurse : solution.getNurses())
        {
            Contract contract = Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract());

            int numberOfConsecutiveAssignments = nurse.second->getNurse()->getHistory().getNumberOfConsecutiveAssignments();

            int numberOfConsecutiveWorkingDays = nurse.second->getNurse()->getHistory().getNumberOfConsecutiveWorkingDays();

            string lastShift = nurse.second->getNurse()->getHistory().getLastAssignedShiftType();

            int day = -1;
            bool done = false;

            //iterate turns
            int turnN = 0;
            for(Turn * turn : nurse.second->getTurns())
            {
                if(lastShift == "None")
                    numberOfConsecutiveWorkingDays = 1;
                //if it stops being consecutive working days
                else if(turn->getDay() != day + 1) {
                    if (numberOfConsecutiveWorkingDays < contract.getMinimumNumberOfConsecutiveWorkingDays())
                        sum += 30 * (contract.getMinimumNumberOfConsecutiveWorkingDays() - numberOfConsecutiveWorkingDays);
                    else if (numberOfConsecutiveWorkingDays > contract.getMaximumNumberOfConsecutiveWorkingDays())
                        sum += 30 * (numberOfConsecutiveWorkingDays - contract.getMinimumNumberOfConsecutiveWorkingDays());


                    if (numberOfConsecutiveAssignments < Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments())
                        sum += 15 * (Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments() - numberOfConsecutiveAssignments);
                    else if (numberOfConsecutiveWorkingDays > Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments())
                        sum += 15 * (numberOfConsecutiveAssignments - Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments());

                    numberOfConsecutiveWorkingDays = 1;
                    numberOfConsecutiveAssignments = 1;
                    done = true;
                }
                else
                    numberOfConsecutiveWorkingDays++;
                if (!done) {
                    if(lastShift == "None"){
                        numberOfConsecutiveAssignments = 1;}
                    else if(lastShift != turn->getShiftType()->getId()) {

                        if (numberOfConsecutiveAssignments < Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments())
                            sum += 15 * (Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments() - numberOfConsecutiveAssignments);
                        else if (numberOfConsecutiveWorkingDays > Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments())
                            sum += 15 * (numberOfConsecutiveAssignments - Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments());

                        numberOfConsecutiveAssignments = 1;
                    }
                    else numberOfConsecutiveAssignments++;
                }

                lastShift = turn->getShiftType()->getId();
                day = turn->getDay();
                done = false;

                turnN++;
                if(turnN == nurse.second->getTurns().size())
                {
                    if(turn->getDay() != 6)
                    {
                        if (numberOfConsecutiveWorkingDays < contract.getMinimumNumberOfConsecutiveWorkingDays())
                            sum += 30 * (contract.getMinimumNumberOfConsecutiveWorkingDays() - numberOfConsecutiveWorkingDays);
                        else if (numberOfConsecutiveWorkingDays > contract.getMaximumNumberOfConsecutiveWorkingDays())
                            sum += 30 * (numberOfConsecutiveWorkingDays - contract.getMinimumNumberOfConsecutiveWorkingDays());


                        if (numberOfConsecutiveAssignments < Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments())
                            sum += 15 * (Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments() - numberOfConsecutiveAssignments);
                        else if (numberOfConsecutiveWorkingDays > Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments())
                            sum += 15 * (numberOfConsecutiveAssignments - Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments());
                    }

                }
            }
        }
    return sum;
}